

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugUtils.cpp
# Opt level: O3

void JsrtDebugUtils::AddSourceMetadataToObject(DynamicObject *object,Utf8SourceInfo *utf8SourceInfo)

{
  AddFileNameOrScriptTypeToObject(object,utf8SourceInfo);
  AddLineCountToObject(object,utf8SourceInfo);
  AddPropertyToObject(object,(JsrtDebugPropertyId)0x1d,utf8SourceInfo->m_cchLength,
                      (utf8SourceInfo->m_scriptContext).ptr);
  if ((utf8SourceInfo->m_debugDocument).ptr != (DebugDocument *)0x0) {
    AddScriptIdToObject(object,utf8SourceInfo);
    return;
  }
  return;
}

Assistant:

void JsrtDebugUtils::AddSourceMetadataToObject(Js::DynamicObject * object, Js::Utf8SourceInfo * utf8SourceInfo)
{
    JsrtDebugUtils::AddFileNameOrScriptTypeToObject(object, utf8SourceInfo);
    JsrtDebugUtils::AddLineCountToObject(object, utf8SourceInfo);
    JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::sourceLength, utf8SourceInfo->GetCchLength(), utf8SourceInfo->GetScriptContext());

    if (utf8SourceInfo->HasDebugDocument())
    {
        // Only add the script ID in cases where a debug document exists
        JsrtDebugUtils::AddScriptIdToObject(object, utf8SourceInfo);
    }
}